

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

IVal * deqp::gls::BuiltinPrecisionTests::
       ContainerTraits<tcu::Matrix<float,_2,_2>,_tcu::Matrix<tcu::Interval,_2,_2>_>::doConvert
                 (IVal *__return_storage_ptr__,FloatFormat *fmt,IVal *value)

{
  Vector<tcu::Interval,_2> *pVVar1;
  IVal local_50;
  
  tcu::Matrix<tcu::Interval,_2,_2>::Matrix(__return_storage_ptr__);
  ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doConvert
            (&local_50,fmt,(IVal *)value);
  (__return_storage_ptr__->m_data).m_data[0].m_data[1].m_lo = local_50.m_data[1].m_lo;
  (__return_storage_ptr__->m_data).m_data[0].m_data[1].m_hi = local_50.m_data[1].m_hi;
  (__return_storage_ptr__->m_data).m_data[0].m_data[0].m_hi = local_50.m_data[0].m_hi;
  (__return_storage_ptr__->m_data).m_data[0].m_data[1].m_hasNaN = local_50.m_data[1].m_hasNaN;
  *(undefined7 *)&(__return_storage_ptr__->m_data).m_data[0].m_data[1].field_0x1 =
       local_50.m_data[1]._1_7_;
  (__return_storage_ptr__->m_data).m_data[0].m_data[0].m_hasNaN = local_50.m_data[0].m_hasNaN;
  *(undefined7 *)&(__return_storage_ptr__->m_data).m_data[0].m_data[0].field_0x1 =
       local_50.m_data[0]._1_7_;
  (__return_storage_ptr__->m_data).m_data[0].m_data[0].m_lo = local_50.m_data[0].m_lo;
  ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doConvert
            (&local_50,fmt,(value->m_data).m_data + 1);
  (__return_storage_ptr__->m_data).m_data[1].m_data[1].m_lo = local_50.m_data[1].m_lo;
  (__return_storage_ptr__->m_data).m_data[1].m_data[1].m_hi = local_50.m_data[1].m_hi;
  (__return_storage_ptr__->m_data).m_data[1].m_data[0].m_hi = local_50.m_data[0].m_hi;
  pVVar1 = (__return_storage_ptr__->m_data).m_data;
  pVVar1[1].m_data[1].m_hasNaN = local_50.m_data[1].m_hasNaN;
  *(undefined7 *)&pVVar1[1].m_data[1].field_0x1 = local_50.m_data[1]._1_7_;
  (__return_storage_ptr__->m_data).m_data[1].m_data[0].m_hasNaN = local_50.m_data[0].m_hasNaN;
  *(undefined7 *)&(__return_storage_ptr__->m_data).m_data[1].m_data[0].field_0x1 =
       local_50.m_data[0]._1_7_;
  (__return_storage_ptr__->m_data).m_data[1].m_data[0].m_lo = local_50.m_data[0].m_lo;
  return __return_storage_ptr__;
}

Assistant:

static IVal			doConvert		(const FloatFormat& fmt, const IVal& value)
	{
		IVal ret;

		for (int ndx = 0; ndx < T::SIZE; ++ndx)
			ret[ndx] = convert<Element>(fmt, value[ndx]);

		return ret;
	}